

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlwaysFFAssignmentOutsideConditional.cpp
# Opt level: O3

void __thiscall
always_ff_assignment_outside_conditional::MainVisitor::handle
          (MainVisitor *this,VariableSymbol *symbol)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  Diagnostic *this_00;
  SourceLocation *pSVar4;
  string_view path;
  AlwaysFFVisitor visitor;
  undefined1 local_f0 [48];
  bool local_c0;
  Path local_a8;
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *local_70;
  SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL> local_68;
  
  path = slang::SourceManager::getFileName
                   (*(SourceManager **)this,(symbol->super_ValueSymbol).super_Symbol.location);
  bVar3 = TidyVisitor::skip((TidyVisitor *)this,path);
  if (!bVar3) {
    slang::ast::ValueSymbol::drivers
              ((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                *)local_f0,&symbol->super_ValueSymbol);
    bVar3 = slang::IntervalMapDetails::Path::operator==((Path *)(local_f0 + 8),&local_a8);
    pcVar1 = local_a8.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
             firstElement;
    if (local_a8.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
        (pointer)pcVar1) {
      operator_delete(local_a8.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                      data_);
    }
    if ((pointer)local_f0._8_8_ != (pointer)(local_f0 + 0x20)) {
      operator_delete((void *)local_f0._8_8_);
    }
    if (!bVar3) {
      slang::ast::ValueSymbol::drivers
                ((subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
                  *)local_f0,&symbol->super_ValueSymbol);
      local_70 = (IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *)local_f0._0_8_;
      slang::SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
                (&local_68,(Base *)(local_f0 + 8));
      lVar2 = *(long *)((long)local_68.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                              .data_[local_68.
                                     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                     len - 1].node +
                       (ulong)local_68.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                              .data_[local_68.
                                     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                                     len - 1].offset * 8 + 0x80);
      if (local_68.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
          (pointer)local_68.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                   firstElement) {
        operator_delete(local_68.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                       );
      }
      if (local_a8.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
          (pointer)pcVar1) {
        operator_delete(local_a8.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                        data_);
      }
      if ((pointer)local_f0._8_8_ != (pointer)(local_f0 + 0x20)) {
        operator_delete((void *)local_f0._8_8_);
      }
      if ((lVar2 != 0) && (*(char *)(lVar2 + 0x1a) == '\x05')) {
        local_f0._0_8_ = (symbol->super_ValueSymbol).super_Symbol.name._M_len;
        local_f0._8_8_ = (symbol->super_ValueSymbol).super_Symbol.name._M_str;
        local_f0._24_8_ = *(size_type *)(*(long *)(this + 0x10) + 0x60);
        local_f0._16_8_ = *(size_type *)(*(long *)(this + 0x10) + 0x68);
        local_f0._32_2_ = 0;
        local_c0 = false;
        slang::ast::Symbol::visit<always_ff_assignment_outside_conditional::AlwaysFFVisitor&>
                  (*(Symbol **)(lVar2 + 8),(AlwaysFFVisitor *)local_f0);
        if ((local_f0[0x20] == true) && ((local_f0._32_2_ & 0x100) != 0)) {
          pSVar4 = &(symbol->super_ValueSymbol).super_Symbol.location;
          if ((local_c0 & 1U) != 0) {
            pSVar4 = (SourceLocation *)(local_f0 + 0x28);
          }
          this_00 = slang::Diagnostics::add(*(Diagnostics **)(this + 8),(DiagCode)0x10010,*pSVar4);
          slang::Diagnostic::operator<<(this_00,(symbol->super_ValueSymbol).super_Symbol.name);
        }
      }
    }
  }
  return;
}

Assistant:

void handle(const VariableSymbol& symbol) {
        NEEDS_SKIP_SYMBOL(symbol)
        if (symbol.drivers().empty())
            return;

        auto firstDriver = *symbol.drivers().begin();
        if (firstDriver && firstDriver->source == DriverSource::AlwaysFF) {
            AlwaysFFVisitor visitor(symbol.name, config.getCheckConfigs().resetName);
            firstDriver->containingSymbol->visit(visitor);
            if (visitor.hasError()) {
                diags.add(diag::RegisterNotAssignedOnReset,
                          visitor.getErrorLocation().value_or(symbol.location))
                    << symbol.name;
            }
        }
    }